

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_tls_read_group(mbedtls_ecp_group *grp,uchar **buf,size_t len)

{
  mbedtls_ecp_group_id local_30;
  int local_2c;
  mbedtls_ecp_group_id grp_id;
  int ret;
  size_t len_local;
  uchar **buf_local;
  mbedtls_ecp_group *grp_local;
  
  local_2c = 0xffffff92;
  _grp_id = len;
  len_local = (size_t)buf;
  buf_local = (uchar **)grp;
  local_2c = mbedtls_ecp_tls_read_group_id(&local_30,buf,len);
  grp_local._4_4_ = local_2c;
  if (local_2c == 0) {
    grp_local._4_4_ = mbedtls_ecp_group_load((mbedtls_ecp_group *)buf_local,local_30);
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_tls_read_group( mbedtls_ecp_group *grp,
                                const unsigned char **buf, size_t len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_group_id grp_id;
    ECP_VALIDATE_RET( grp  != NULL );
    ECP_VALIDATE_RET( buf  != NULL );
    ECP_VALIDATE_RET( *buf != NULL );

    if( ( ret = mbedtls_ecp_tls_read_group_id( &grp_id, buf, len ) ) != 0 )
        return( ret );

    return( mbedtls_ecp_group_load( grp, grp_id ) );
}